

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void cftfx41(int n,double *a,int nw,double *w)

{
  double *w_local;
  int nw_local;
  double *a_local;
  int n_local;
  
  if (n == 0x80) {
    cftf161(a,w + (nw + -8));
    cftf162(a + 0x20,w + (nw + -0x20));
    cftf161(a + 0x40,w + (nw + -8));
    cftf161(a + 0x60,w + (nw + -8));
  }
  else {
    cftf081(a,w + (nw + -8));
    cftf082(a + 0x10,w + (nw + -8));
    cftf081(a + 0x20,w + (nw + -8));
    cftf081(a + 0x30,w + (nw + -8));
  }
  return;
}

Assistant:

void cftfx41(int n, double *a, int nw, double *w) {
  void cftf161(double *a, double *w);
  void cftf162(double *a, double *w);
  void cftf081(double *a, double *w);
  void cftf082(double *a, double *w);

  if (n == 128) {
    cftf161(a, &w[nw - 8]);
    cftf162(&a[32], &w[nw - 32]);
    cftf161(&a[64], &w[nw - 8]);
    cftf161(&a[96], &w[nw - 8]);
  } else {
    cftf081(a, &w[nw - 8]);
    cftf082(&a[16], &w[nw - 8]);
    cftf081(&a[32], &w[nw - 8]);
    cftf081(&a[48], &w[nw - 8]);
  }
}